

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

char * JS_AtomToCString(JSContext *ctx,JSAtom atom)

{
  char *pcVar1;
  JSValue val1;
  
  val1 = JS_AtomToString(ctx,atom);
  if ((int)val1.tag == 6) {
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar1 = JS_ToCString(ctx,val1);
    JS_FreeValue(ctx,val1);
  }
  return pcVar1;
}

Assistant:

const char *JS_AtomToCString(JSContext *ctx, JSAtom atom)
{
    JSValue str;
    const char *cstr;

    str = JS_AtomToString(ctx, atom);
    if (JS_IsException(str))
        return NULL;
    cstr = JS_ToCString(ctx, str);
    JS_FreeValue(ctx, str);
    return cstr;
}